

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this,OutPoint *outpoint)

{
  pointer pTVar1;
  AbstractTxIn *pAVar2;
  pointer pOVar3;
  bool bVar4;
  uint uVar5;
  uint32_t vout;
  CfdException *pCVar6;
  AbstractTxIn *this_00;
  OutPoint *target;
  pointer object;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  OutPoint target_outpoint;
  UtxoData work_utxo;
  UtxoData utxo;
  Script local_b20;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_ae8;
  OutPoint local_ac8;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  local_aa0;
  UtxoData local_a80;
  UtxoData local_558;
  
  UtxoData::UtxoData(&local_558);
  bVar4 = IsFindUtxoMap(this,outpoint,&local_558);
  if (!bVar4) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a80.block_height = (uint64_t)&local_a80.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a80,"Utxo is not found. verify fail.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_a80);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar5 = (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0xf])
                    (this,outpoint);
  pTVar1 = (this->super_Transaction).vin_.
           super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_ae8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ae8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ae8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLockingScriptFromUtxoData((Script *)&local_a80,&local_558);
  core::Script::operator=(&local_558.locking_script,(Script *)&local_a80);
  core::Script::~Script((Script *)&local_a80);
  bVar4 = core::Script::IsTaprootScript(&local_558.locking_script);
  if (bVar4) {
    UtxoData::UtxoData(&local_a80);
    this_00 = &((this->super_Transaction).vin_.
                super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->super_AbstractTxIn;
    pAVar2 = &((this->super_Transaction).vin_.
               super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
               super__Vector_impl_data._M_finish)->super_AbstractTxIn;
    if (this_00 != pAVar2) {
      do {
        core::AbstractTxIn::GetTxid((Txid *)&local_b20,this_00);
        vout = core::AbstractTxIn::GetVout(this_00);
        core::OutPoint::OutPoint(&local_ac8,(Txid *)&local_b20,vout);
        local_b20._vptr_Script = (_func_int **)&PTR__Txid_0086d9f8;
        if (local_b20.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b20.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b20.script_data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b20.script_data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar4 = IsFindUtxoMap(this,&local_ac8,&local_a80);
        if (!bVar4) {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          local_b20._vptr_Script =
               (_func_int **)
               &local_b20.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b20,"Utxo is not found. Verify fail.","");
          core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_b20);
          __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        GetLockingScriptFromUtxoData(&local_b20,&local_a80);
        core::Script::operator=(&local_a80.locking_script,&local_b20);
        core::Script::~Script(&local_b20);
        std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                  ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&local_ae8,&local_a80);
        local_ac8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
        if (local_ac8.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_ac8.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_ac8.txid_.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_ac8.txid_.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pAVar2);
    }
    UtxoData::~UtxoData(&local_a80);
  }
  local_aa0.super__Function_base._M_functor._8_8_ = 0;
  local_aa0.super__Function_base._M_functor._M_unused._M_object = CreateTxSighash;
  local_aa0._M_invoker =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_invoke;
  local_aa0.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_manager;
  TransactionContextUtil::Verify<cfd::TransactionContext>
            (this,outpoint,&local_558,&pTVar1[uVar5].super_AbstractTxIn,&local_aa0);
  if (local_aa0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_aa0.super__Function_base._M_manager)
              ((_Any_data *)&local_aa0,(_Any_data *)&local_aa0,__destroy_functor);
  }
  pOVar3 = (this->verify_map_).
           super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (object = (this->verify_map_).
                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
                _M_impl.super__Vector_impl_data._M_start; object != pOVar3; object = object + 1) {
    bVar4 = core::OutPoint::operator==(outpoint,object);
    if (bVar4) goto LAB_003c9f01;
  }
  std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
  emplace_back<cfd::core::OutPoint_const&>
            ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)&this->verify_map_,
             outpoint);
LAB_003c9f01:
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_ae8);
  UtxoData::~UtxoData(&local_558);
  return;
}

Assistant:

void TransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  std::vector<UtxoData> utxo_list;
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    UtxoData work_utxo;
    for (const auto& txin_ref : vin_) {
      OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
      if (!IsFindUtxoMap(target_outpoint, &work_utxo)) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo is not found. Verify fail.");
      }
      work_utxo.locking_script = GetLockingScriptFromUtxoData(work_utxo);
      utxo_list.emplace_back(work_utxo);
    }
  }
  TransactionContextUtil::Verify<TransactionContext>(
      this, outpoint, utxo, &txin, CreateTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}